

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O1

void Abc_FlowRetime_Dfs_forw(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pObj_00;
  void **ppvVar4;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    return;
  }
  pAVar3 = pObj->pNtk;
  iVar7 = pAVar3->nTravIds;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar1] = iVar7;
  if (0 < (pObj->vFanouts).nSize) {
    lVar6 = 0;
    uVar5 = extraout_RDX;
    do {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
      pAVar3 = pObj_00->pNtk;
      iVar7 = pObj_00->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,(int)uVar5);
      if (((long)iVar7 < 0) || ((pAVar3->vTravIds).nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar5 = extraout_RDX_00;
      if ((pAVar3->vTravIds).pArray[iVar7] != pObj_00->pNtk->nTravIds) {
        Abc_FlowRetime_Dfs_forw(pObj_00,vNodes);
        uVar5 = extraout_RDX_01;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pObj->vFanouts).nSize);
  }
  uVar2 = vNodes->nCap;
  if (vNodes->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar4;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar2 * 2;
      if (iVar7 <= (int)uVar2) goto LAB_004de4f6;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
      }
      vNodes->pArray = ppvVar4;
    }
    vNodes->nCap = iVar7;
  }
LAB_004de4f6:
  iVar7 = vNodes->nSize;
  vNodes->nSize = iVar7 + 1;
  vNodes->pArray[iVar7] = pObj;
  return;
}

Assistant:

void Abc_FlowRetime_Dfs_forw( Abc_Obj_t * pObj, Vec_Ptr_t *vNodes ) {
  Abc_Obj_t *pNext;
  int i;

  if (Abc_ObjIsLatch(pObj)) return;

  Abc_NodeSetTravIdCurrent( pObj );
  
  Abc_ObjForEachFanout( pObj, pNext, i )
    if (!Abc_NodeIsTravIdCurrent( pNext ))
      Abc_FlowRetime_Dfs_forw( pNext, vNodes );

  Vec_PtrPush( vNodes, pObj );
}